

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O0

lzma_index * lzma_index_init(lzma_allocator *allocator)

{
  index_stream *node;
  index_stream *s;
  lzma_index *i;
  lzma_allocator *allocator_local;
  
  allocator_local = (lzma_allocator *)index_init_plain(allocator);
  if ((lzma_index *)allocator_local == (lzma_index *)0x0) {
    allocator_local = (lzma_allocator *)0x0;
  }
  else {
    node = index_stream_init(0,0,1,0,allocator);
    if (node == (index_stream *)0x0) {
      lzma_free(allocator_local,allocator);
      allocator_local = (lzma_allocator *)0x0;
    }
    else {
      index_tree_append((index_tree *)allocator_local,&node->node);
    }
  }
  return (lzma_index *)allocator_local;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_init(const lzma_allocator *allocator)
{
	lzma_index *i = index_init_plain(allocator);
	if (i == NULL)
		return NULL;

	index_stream *s = index_stream_init(0, 0, 1, 0, allocator);
	if (s == NULL) {
		lzma_free(i, allocator);
		return NULL;
	}

	index_tree_append(&i->streams, &s->node);

	return i;
}